

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O3

Error asmjit::v1_14::BaseBuilder_newLabelInternal(BaseBuilder *self,uint32_t labelId)

{
  ZoneVector<asmjit::v1_14::LabelNode_*> *this;
  uint uVar1;
  CodeHolder *this_00;
  Error EVar2;
  Error extraout_EAX;
  size_t nameSize;
  char *name;
  uint n;
  undefined4 uVar3;
  BaseBuilder *self_00;
  ZoneVector<asmjit::v1_14::LabelNode_*> *pZVar4;
  LabelType in_R8B;
  uint32_t in_R9D;
  undefined8 *unaff_R13;
  BaseBuilder *unaff_R14;
  LabelEntry *pLStack_58;
  ulong uStack_50;
  BaseBuilder *pBStack_48;
  code *pcStack_40;
  size_t sStack_38;
  
  uVar1 = *(uint *)&self->field_0x190;
  n = labelId + 1;
  if (n <= uVar1) {
    pcStack_40 = (code *)0x116f29;
    BaseBuilder_newLabelInternal();
    EVar2 = extraout_EAX;
LAB_00116f29:
    EVar2 = BaseEmitter::reportError(&unaff_R14->super_BaseEmitter,EVar2,(char *)0x0);
    return EVar2;
  }
  this = &self->_labelNodes;
  self_00 = (BaseBuilder *)&self->_allocator;
  if (*(int *)&self->field_0x194 - uVar1 < labelId - uVar1) {
    pcStack_40 = (code *)0x116e94;
    EVar2 = ZoneVectorBase::_grow((ZoneVectorBase *)this,(ZoneAllocator *)self_00,8,labelId - uVar1)
    ;
    unaff_R14 = self;
    if (EVar2 != 0) goto LAB_00116f29;
  }
  if (*(long *)&((ZoneAllocator *)self_00)->field_0x0 == 0) {
    pcStack_40 = (code *)0x116f48;
    BaseBuilder_newLabelInternal();
  }
  else {
    pcStack_40 = (code *)0x116eb7;
    unaff_R13 = (undefined8 *)ZoneAllocator::_alloc((ZoneAllocator *)self_00,0x38,&sStack_38);
    if (unaff_R13 != (undefined8 *)0x0) {
      *unaff_R13 = 0;
      unaff_R13[1] = 0;
      *(undefined1 *)(unaff_R13 + 2) = 3;
      *(NodeFlags *)((long)unaff_R13 + 0x11) = self->_nodeFlags | (kActsAsLabel|kHasNoEffect);
      *(undefined8 *)((long)unaff_R13 + 0x12) = 0;
      *(undefined8 *)((long)unaff_R13 + 0x1a) = 0;
      unaff_R13[4] = 0;
      unaff_R13[5] = 0;
      *(uint32_t *)(unaff_R13 + 6) = labelId;
      goto LAB_00116eeb;
    }
  }
  pcStack_40 = (code *)0x116f57;
  EVar2 = BaseEmitter::reportError(&self->super_BaseEmitter,1,(char *)0x0);
  if (EVar2 != 0) {
    return EVar2;
  }
LAB_00116eeb:
  nameSize = (size_t)n;
  pcStack_40 = (code *)0x116efd;
  pZVar4 = this;
  ZoneVectorBase::_resize((ZoneVectorBase *)this,(ZoneAllocator *)self_00,8,n);
  if (labelId < *(uint *)&self->field_0x190) {
    *(undefined8 **)(*(long *)&this->field_0x0 + (ulong)labelId * 8) = unaff_R13;
    *(uint32_t *)(unaff_R13 + 6) = labelId;
    return 0;
  }
  pcStack_40 = BaseBuilder::newNamedLabel;
  BaseBuilder_newLabelInternal();
  this_00 = (self_00->super_BaseEmitter)._code;
  uVar3 = 0xffffffff;
  if (((this_00 != (CodeHolder *)0x0) &&
      (uStack_50 = (ulong)labelId, pBStack_48 = self, pcStack_40 = (code *)(ulong)n,
      EVar2 = CodeHolder::newNamedLabelEntry(this_00,&pLStack_58,name,nameSize,in_R8B,in_R9D),
      EVar2 == 0)) &&
     (EVar2 = BaseBuilder_newLabelInternal(self_00,*(uint32_t *)&pLStack_58->field_0xc), EVar2 == 0)
     ) {
    uVar3 = *(undefined4 *)&pLStack_58->field_0xc;
  }
  *(undefined4 *)&pZVar4->field_0x0 = 5;
  *(undefined4 *)(pZVar4 + 4) = uVar3;
  *(undefined8 *)(pZVar4 + 8) = 0;
  return (Error)pZVar4;
}

Assistant:

static Error BaseBuilder_newLabelInternal(BaseBuilder* self, uint32_t labelId) {
  ASMJIT_ASSERT(self->_labelNodes.size() < labelId + 1);

  uint32_t growBy = labelId - self->_labelNodes.size();
  Error err = self->_labelNodes.willGrow(&self->_allocator, growBy);

  if (ASMJIT_UNLIKELY(err))
    return self->reportError(err);

  LabelNode* node;
  ASMJIT_PROPAGATE(self->_newNodeT<LabelNode>(&node, labelId));

  self->_labelNodes.resize(&self->_allocator, labelId + 1);
  self->_labelNodes[labelId] = node;
  node->_labelId = labelId;
  return kErrorOk;
}